

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPExternalTransmitter::Create
          (RTPExternalTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  int iVar1;
  
  iVar1 = -0x97;
  if ((((this->init == true) && (iVar1 = -0x8b, this->created == false)) &&
      (iVar1 = -0x90, transparams != (RTPTransmissionParams *)0x0)) &&
     ((transparams->protocol == ExternalProto &&
      (iVar1 = RTPAbortDescriptors::Init(&this->m_abortDesc), -1 < iVar1)))) {
    this->maxpacksize = maximumpacketsize;
    this->sender = (RTPExternalSender *)transparams[1]._vptr_RTPTransmissionParams;
    this->headersize = transparams[1].protocol;
    this->localhostname = (uint8_t *)0x0;
    this->localhostnamelength = 0;
    this->created = true;
    this->waitingfordata = false;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPExternalTransmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
	const RTPExternalTransmissionParams *params;
	int status;

	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ILLEGALPARAMETERS;
	}
	if (transparams->GetTransmissionProtocol() != RTPTransmitter::ExternalProto)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ILLEGALPARAMETERS;
	}
		
	params = (const RTPExternalTransmissionParams *)transparams;

	if ((status = m_abortDesc.Init()) < 0)
	{
		MAINMUTEX_UNLOCK
		return status;
	}
	
	maxpacksize = maximumpacketsize;
	sender = params->GetSender();
	headersize = params->GetAdditionalHeaderSize();

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;
	MAINMUTEX_UNLOCK
	return 0;
}